

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.hpp
# Opt level: O2

size_t __thiscall jessilib::object::hash(object *this)

{
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_JAJames[P]Jupiter_Bot_src_Jupiter_src_jessilib_src_common____include_jessilib_object_hpp:452:21),_const_std::variant<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>_&>
  _Var1;
  anon_class_1_0_00000001 local_1;
  
  _Var1 = std::
          visit<jessilib::object::hash()const::_lambda(auto:1&&)_1_,std::variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>const&>
                    (&local_1,&this->m_value);
  return _Var1;
}

Assistant:

size_t hash() const {
		return std::visit([](auto&& value) -> size_t {
			using T = typename std::decay<decltype(value)>::type;

			if constexpr (std::is_same<T, null_variant_t>::value) {
				return 0;
			}
			else if constexpr (std::is_same<T, array_type>::value) {
				size_t result{};
				for (auto& obj : value) {
					result += obj.hash();
				}

				return result;
			}
			else if constexpr (std::is_same<T, map_type>::value) {
				size_t result{};
				for (auto& pair : value) {
					result += std::hash<string_type>{}(pair.first);
				}

				return result;
			}
			else if constexpr (std::is_same<T, data_type>::value) {
				// TODO: pull this into a separate method
				uint64_t hash = 14695981039346656037ULL;

				for (auto byte : value) {
					hash = hash ^ byte;
					hash = hash * 1099511628211ULL;
				}

				return hash;
			}
			else {
				return std::hash<T>{}(std::forward<decltype(value)>(value));
			}
		}, m_value);
	}